

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseTemplateArgs(Db *this,bool TagTemplates)

{
  Node **ppNVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  BumpPointerAllocator **ppBVar4;
  Node **__src;
  char *pcVar5;
  Node *pNVar6;
  Node **__dest;
  Node *pNVar7;
  char *pcVar8;
  _func_int **pp_Var9;
  long lVar10;
  Node *pNVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  _func_int **pp_Var14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this_00;
  Node **ppNVar19;
  Node NVar20;
  Node *Arg_1;
  Node *Arg;
  Node *local_b0;
  Node *local_a8;
  BumpPointerAllocator **ppBStack_a0;
  Node local_98 [4];
  BumpPointerAllocator *local_58;
  PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL> *local_50;
  size_t local_48;
  PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *local_40;
  Node *local_38;
  
  pcVar5 = this->First;
  pcVar8 = this->Last;
  if ((pcVar5 == pcVar8) || (*pcVar5 != 'I')) {
    return (Node *)0x0;
  }
  pcVar5 = pcVar5 + 1;
  this->First = pcVar5;
  if (TagTemplates) {
    (this->TemplateParams).Last = (this->TemplateParams).First;
  }
  this_00 = &this->Names;
  local_48 = (long)(this->Names).Last - (long)(this->Names).First >> 3;
  ppNVar1 = (this->TemplateParams).Inline;
  local_50 = &this->ForwardTemplateRefs;
  local_58 = &this->ASTAllocator;
  local_40 = this_00;
  do {
    if ((pcVar5 != pcVar8) && (*pcVar5 == 'E')) {
      this->First = pcVar5 + 1;
      NVar20 = (Node)popTrailingNodeArray(this,local_48);
      pNVar7 = (Node *)BumpPointerAllocator::allocate(local_58,0x20);
      pNVar7->K = KTemplateArgs;
      pNVar7->RHSComponentCache = No;
      pNVar7->ArrayCache = No;
      pNVar7->FunctionCache = No;
      pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e5f8;
      pNVar7[1] = NVar20;
      return pNVar7;
    }
    if (TagTemplates) {
      ppBStack_a0 = &local_58;
      pNVar7 = (Node *)(this->TemplateParams).First;
      if (pNVar7 == (Node *)ppNVar1) {
        sVar18 = (long)(this->TemplateParams).Last - (long)ppNVar1;
        local_b0 = local_98;
        if (sVar18 == 0) {
          sVar18 = 0;
        }
        else {
          local_a8 = local_98;
          memmove(local_98,pNVar7,sVar18);
        }
        local_a8 = (Node *)((long)&local_98[0]._vptr_Node + sVar18);
        (this->TemplateParams).Last = (Node **)pNVar7;
      }
      else {
        local_a8 = (Node *)(this->TemplateParams).Last;
        ppBStack_a0 = (BumpPointerAllocator **)(this->TemplateParams).Cap;
        (this->TemplateParams).First = ppNVar1;
        (this->TemplateParams).Last = ppNVar1;
        (this->TemplateParams).Cap = (Node **)local_50;
        local_b0 = pNVar7;
      }
      pNVar6 = parseTemplateArg(this);
      pNVar7 = (Node *)(this->TemplateParams).First;
      local_38 = pNVar6;
      if (local_b0 == local_98) {
        if (pNVar7 != (Node *)ppNVar1) {
          free(pNVar7);
          (this->TemplateParams).First = ppNVar1;
          (this->TemplateParams).Last = ppNVar1;
          (this->TemplateParams).Cap = (Node **)local_50;
          pNVar7 = (Node *)ppNVar1;
        }
        pNVar11 = local_b0;
        if ((long)local_a8 - (long)local_b0 != 0) {
          memmove(pNVar7,local_b0,(long)local_a8 - (long)local_b0);
          pNVar7 = (Node *)(this->TemplateParams).First;
          pNVar11 = local_a8;
        }
        (this->TemplateParams).Last = (Node **)(((long)pNVar11 - (long)local_b0) + (long)pNVar7);
        local_a8 = local_b0;
      }
      else {
        (this->TemplateParams).First = (Node **)local_b0;
        if (pNVar7 == (Node *)ppNVar1) {
          (this->TemplateParams).Last = (Node **)local_a8;
          (this->TemplateParams).Cap = (Node **)ppBStack_a0;
          ppBStack_a0 = &local_58;
          local_a8 = local_98;
        }
        else {
          ppBVar4 = (BumpPointerAllocator **)(this->TemplateParams).Cap;
          (this->TemplateParams).Last = (Node **)local_a8;
          (this->TemplateParams).Cap = (Node **)ppBStack_a0;
          local_a8 = pNVar7;
          ppBStack_a0 = ppBVar4;
        }
      }
      local_b0 = local_a8;
      if (pNVar6 == (Node *)0x0) {
        if (local_a8 == local_98) {
          return (Node *)0x0;
        }
        free(local_a8);
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_00,&local_38);
      if (pNVar6->K == KTemplateArgumentPack) {
        pp_Var9 = pNVar6[1]._vptr_Node;
        uVar17 = *(ulong *)&pNVar6[1].K;
        pNVar6 = (Node *)BumpPointerAllocator::allocate(local_58,0x20);
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e5a0;
        pNVar6[1]._vptr_Node = pp_Var9;
        pNVar6[1].K = (char)uVar17;
        pNVar6[1].RHSComponentCache = (char)(uVar17 >> 8);
        pNVar6[1].ArrayCache = (char)(uVar17 >> 0x10);
        pNVar6[1].FunctionCache = (char)(uVar17 >> 0x18);
        *(int *)&pNVar6[1].field_0xc = (int)(uVar17 >> 0x20);
        pNVar6->K = KParameterPack;
        pNVar6->RHSComponentCache = Unknown;
        pNVar6->ArrayCache = Unknown;
        pNVar6->FunctionCache = Unknown;
        uVar3 = uVar17 * 8;
        pp_Var2 = pp_Var9 + uVar17;
        lVar10 = (long)uVar17 >> 2;
        uVar16 = (uint)uVar17;
        pp_Var12 = pp_Var9;
        uVar13 = uVar17;
        if (0 < lVar10) {
          pp_Var12 = (_func_int **)((uVar3 & 0xffffffffffffffe0) + (long)pp_Var9);
          lVar15 = lVar10 + 1;
          pp_Var14 = pp_Var9 + 2;
          do {
            if (pp_Var14[-2][10] != (_func_int)0x1) {
              pp_Var14 = pp_Var14 + -2;
              goto LAB_001d4c34;
            }
            if (pp_Var14[-1][10] != (_func_int)0x1) {
              pp_Var14 = pp_Var14 + -1;
              goto LAB_001d4c34;
            }
            if ((*pp_Var14)[10] != (_func_int)0x1) goto LAB_001d4c34;
            if (pp_Var14[1][10] != (_func_int)0x1) {
              pp_Var14 = pp_Var14 + 1;
              goto LAB_001d4c34;
            }
            lVar15 = lVar15 + -1;
            pp_Var14 = pp_Var14 + 4;
          } while (1 < lVar15);
          uVar13 = (ulong)(uVar16 & 3);
        }
        if (uVar13 == 1) {
LAB_001d4c11:
          pp_Var14 = pp_Var12;
          if ((*pp_Var12)[10] != (_func_int)0x1) goto LAB_001d4c34;
LAB_001d4c39:
          pNVar6->ArrayCache = No;
        }
        else {
          if (uVar13 == 2) {
LAB_001d4c04:
            pp_Var14 = pp_Var12;
            if ((*pp_Var12)[10] == (_func_int)0x1) {
              pp_Var12 = pp_Var12 + 1;
              goto LAB_001d4c11;
            }
          }
          else {
            if (uVar13 != 3) goto LAB_001d4c39;
            pp_Var14 = pp_Var12;
            if ((*pp_Var12)[10] == (_func_int)0x1) {
              pp_Var12 = pp_Var12 + 1;
              goto LAB_001d4c04;
            }
          }
LAB_001d4c34:
          if (pp_Var14 == pp_Var2) goto LAB_001d4c39;
        }
        pp_Var12 = pp_Var9;
        uVar13 = uVar17;
        if (0 < lVar10) {
          pp_Var12 = (_func_int **)((uVar3 & 0xffffffffffffffe0) + (long)pp_Var9);
          lVar15 = lVar10 + 1;
          pp_Var14 = pp_Var9 + 2;
          do {
            if (pp_Var14[-2][0xb] != (_func_int)0x1) {
              pp_Var14 = pp_Var14 + -2;
              goto LAB_001d4ce8;
            }
            if (pp_Var14[-1][0xb] != (_func_int)0x1) {
              pp_Var14 = pp_Var14 + -1;
              goto LAB_001d4ce8;
            }
            if ((*pp_Var14)[0xb] != (_func_int)0x1) goto LAB_001d4ce8;
            if (pp_Var14[1][0xb] != (_func_int)0x1) {
              pp_Var14 = pp_Var14 + 1;
              goto LAB_001d4ce8;
            }
            lVar15 = lVar15 + -1;
            pp_Var14 = pp_Var14 + 4;
          } while (1 < lVar15);
          uVar13 = (ulong)(uVar16 & 3);
        }
        if (uVar13 == 1) {
LAB_001d4cc5:
          pp_Var14 = pp_Var12;
          if ((*pp_Var12)[0xb] != (_func_int)0x1) goto LAB_001d4ce8;
LAB_001d4ced:
          pNVar6->FunctionCache = No;
        }
        else {
          if (uVar13 == 2) {
LAB_001d4cb8:
            pp_Var14 = pp_Var12;
            if ((*pp_Var12)[0xb] == (_func_int)0x1) {
              pp_Var12 = pp_Var12 + 1;
              goto LAB_001d4cc5;
            }
          }
          else {
            if (uVar13 != 3) goto LAB_001d4ced;
            pp_Var14 = pp_Var12;
            if ((*pp_Var12)[0xb] == (_func_int)0x1) {
              pp_Var12 = pp_Var12 + 1;
              goto LAB_001d4cb8;
            }
          }
LAB_001d4ce8:
          if (pp_Var14 == pp_Var2) goto LAB_001d4ced;
        }
        if (0 < lVar10) {
          pp_Var12 = (_func_int **)((uVar3 & 0xffffffffffffffe0) + (long)pp_Var9);
          lVar10 = lVar10 + 1;
          pp_Var9 = pp_Var9 + 2;
          do {
            if (pp_Var9[-2][9] != (_func_int)0x1) {
              pp_Var9 = pp_Var9 + -2;
              goto LAB_001d4dad;
            }
            if (pp_Var9[-1][9] != (_func_int)0x1) {
              pp_Var9 = pp_Var9 + -1;
              goto LAB_001d4dad;
            }
            if ((*pp_Var9)[9] != (_func_int)0x1) goto LAB_001d4dad;
            if (pp_Var9[1][9] != (_func_int)0x1) {
              pp_Var9 = pp_Var9 + 1;
              goto LAB_001d4dad;
            }
            lVar10 = lVar10 + -1;
            pp_Var9 = pp_Var9 + 4;
          } while (1 < lVar10);
          uVar17 = (ulong)(uVar16 & 3);
          pp_Var9 = pp_Var12;
        }
        if (uVar17 == 1) {
LAB_001d4d96:
          if ((*pp_Var9)[9] != (_func_int)0x1) goto LAB_001d4dad;
        }
        else {
          if (uVar17 == 2) {
LAB_001d4d7d:
            if ((*pp_Var9)[9] == (_func_int)0x1) {
              pp_Var9 = pp_Var9 + 1;
              goto LAB_001d4d96;
            }
          }
          else {
            if (uVar17 != 3) goto LAB_001d4db2;
            if ((*pp_Var9)[9] == (_func_int)0x1) {
              pp_Var9 = pp_Var9 + 1;
              goto LAB_001d4d7d;
            }
          }
LAB_001d4dad:
          if (pp_Var9 != pp_Var2) goto LAB_001d4db7;
        }
LAB_001d4db2:
        pNVar6->RHSComponentCache = No;
      }
LAB_001d4db7:
      ppNVar19 = (this->TemplateParams).Last;
      if (ppNVar19 == (this->TemplateParams).Cap) {
        __src = (this->TemplateParams).First;
        sVar18 = (long)ppNVar19 - (long)__src;
        if (__src == ppNVar1) {
          __dest = (Node **)malloc(sVar18 * 2);
          if (__dest == (Node **)0x0) goto LAB_001d4ee9;
          if (ppNVar19 != ppNVar1) {
            memmove(__dest,__src,sVar18);
          }
          (this->TemplateParams).First = __dest;
        }
        else {
          __dest = (Node **)realloc(__src,sVar18 * 2);
          (this->TemplateParams).First = __dest;
          if (__dest == (Node **)0x0) {
LAB_001d4ee9:
            std::terminate();
          }
        }
        ppNVar19 = (Node **)((long)__dest + sVar18);
        (this->TemplateParams).Cap = __dest + ((long)sVar18 >> 2);
        this_00 = local_40;
      }
      (this->TemplateParams).Last = ppNVar19 + 1;
      *ppNVar19 = pNVar6;
      if (local_b0 != local_98) {
        free(local_b0);
      }
    }
    else {
      local_b0 = parseTemplateArg(this);
      if (local_b0 == (Node *)0x0) {
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(this_00,&local_b0);
    }
    pcVar5 = this->First;
    pcVar8 = this->Last;
  } while( true );
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }